

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ieee.cc
# Opt level: O0

void TestSingle_IsInfinite(void)

{
  uint32_t min_float32;
  Single in_stack_ffffffffffffffdc;
  undefined1 condition;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 uVar1;
  undefined4 in_stack_ffffffffffffffe4;
  int in_stack_ffffffffffffffec;
  char *in_stack_fffffffffffffff0;
  
  double_conversion::Single::Infinity();
  double_conversion::Single::Single
            ((Single *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
             (float)in_stack_ffffffffffffffdc.d32_);
  double_conversion::Single::IsInfinite
            ((Single *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  CheckHelper(in_stack_fffffffffffffff0,in_stack_ffffffffffffffec,
              (char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
              SUB41(in_stack_ffffffffffffffdc.d32_ >> 0x18,0));
  double_conversion::Single::Infinity();
  double_conversion::Single::Single
            ((Single *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
             (float)in_stack_ffffffffffffffdc.d32_);
  double_conversion::Single::IsInfinite
            ((Single *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  CheckHelper(in_stack_fffffffffffffff0,in_stack_ffffffffffffffec,
              (char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
              SUB41(in_stack_ffffffffffffffdc.d32_ >> 0x18,0));
  double_conversion::Single::NaN();
  double_conversion::Single::Single
            ((Single *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
             (float)in_stack_ffffffffffffffdc.d32_);
  double_conversion::Single::IsInfinite
            ((Single *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  CheckHelper(in_stack_fffffffffffffff0,in_stack_ffffffffffffffec,
              (char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
              SUB41(in_stack_ffffffffffffffdc.d32_ >> 0x18,0));
  double_conversion::Single::Single
            ((Single *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
             (float)in_stack_ffffffffffffffdc.d32_);
  double_conversion::Single::IsInfinite
            ((Single *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  CheckHelper(in_stack_fffffffffffffff0,in_stack_ffffffffffffffec,
              (char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
              SUB41(in_stack_ffffffffffffffdc.d32_ >> 0x18,0));
  double_conversion::Single::Single
            ((Single *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
             (float)in_stack_ffffffffffffffdc.d32_);
  double_conversion::Single::IsInfinite
            ((Single *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  CheckHelper(in_stack_fffffffffffffff0,in_stack_ffffffffffffffec,
              (char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
              SUB41(in_stack_ffffffffffffffdc.d32_ >> 0x18,0));
  double_conversion::Single::Single
            ((Single *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
             (float)in_stack_ffffffffffffffdc.d32_);
  double_conversion::Single::IsInfinite
            ((Single *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  CheckHelper(in_stack_fffffffffffffff0,in_stack_ffffffffffffffec,
              (char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
              SUB41(in_stack_ffffffffffffffdc.d32_ >> 0x18,0));
  double_conversion::Single::Single
            ((Single *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
             (float)in_stack_ffffffffffffffdc.d32_);
  condition = (undefined1)(in_stack_ffffffffffffffdc.d32_ >> 0x18);
  double_conversion::Single::IsInfinite
            ((Single *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  CheckHelper(in_stack_fffffffffffffff0,in_stack_ffffffffffffffec,
              (char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),(bool)condition)
  ;
  uVar1 = 1;
  double_conversion::Single::Single((Single *)&stack0xffffffffffffffdc,1);
  double_conversion::Single::IsInfinite((Single *)CONCAT44(in_stack_ffffffffffffffe4,uVar1));
  CheckHelper(in_stack_fffffffffffffff0,in_stack_ffffffffffffffec,
              (char *)CONCAT44(in_stack_ffffffffffffffe4,uVar1),(bool)condition);
  return;
}

Assistant:

TEST(Single_IsInfinite) {
  CHECK(Single(Single::Infinity()).IsInfinite());
  CHECK(Single(-Single::Infinity()).IsInfinite());
  CHECK(!Single(Single::NaN()).IsInfinite());
  CHECK(!Single(0.0f).IsInfinite());
  CHECK(!Single(-0.0f).IsInfinite());
  CHECK(!Single(1.0f).IsInfinite());
  CHECK(!Single(-1.0f).IsInfinite());
  uint32_t min_float32 = 0x00000001;
  CHECK(!Single(min_float32).IsInfinite());
}